

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O0

shared_ptr<SymbolTable> __thiscall
CConstructSymbolTableVisitor::GetSymbolTable(CConstructSymbolTableVisitor *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<SymbolTable> sVar1;
  CConstructSymbolTableVisitor *this_local;
  
  std::shared_ptr<SymbolTable>::shared_ptr
            ((shared_ptr<SymbolTable> *)this,(shared_ptr<SymbolTable> *)(in_RSI + 8));
  sVar1.super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<SymbolTable>)sVar1.super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SymbolTable> CConstructSymbolTableVisitor::GetSymbolTable()
{
	return table;
}